

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::do_format_double_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double m,int k)

{
  wostream *pwVar1;
  size_t sVar2;
  wostringstream *this_00;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [20];
  int k_;
  uint local_1d8;
  char local_1d4 [20];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  wostringstream woss;
  
  iVar4 = (int)this;
  anon_unknown_1::do_ecvt((ecvt_result *)&k_,m,iVar4);
  this_00 = (wostringstream *)&woss;
  std::__cxx11::wostringstream::wostringstream(this_00);
  if ((int)local_1d8 < 0x16 && iVar4 <= (int)local_1d8) {
    pwVar1 = std::operator<<((wostream *)&woss,local_1d4);
    local_200[0] = local_1f0;
    std::__cxx11::wstring::_M_construct((ulong)local_200,local_1d8 - iVar4);
    std::operator<<(pwVar1,(wstring *)local_200);
  }
  else if (local_1d8 - 1 < 0x15) {
    local_200[0] = local_1f0;
    std::__cxx11::wstring::_M_construct<char*>((wstring *)local_200,local_1d4,local_1d4 + local_1d8)
    ;
    pwVar1 = std::operator<<((wostream *)&woss,(wstring *)local_200);
    pwVar1 = std::operator<<(pwVar1,'.');
    sVar2 = strlen(local_1d4);
    local_1c0[0] = local_1b0;
    std::__cxx11::wstring::_M_construct<char*>
              ((wstring *)local_1c0,local_1d4 + (int)local_1d8,local_1d4 + sVar2);
    std::operator<<(pwVar1,(wstring *)local_1c0);
    std::__cxx11::wstring::~wstring((wstring *)local_1c0);
  }
  else {
    if (5 < local_1d8 + 5) {
      if (iVar4 == 1) {
        pcVar5 = local_1d4;
      }
      else {
        pwVar1 = std::operator<<((wostream *)&woss,local_1d4[0]);
        this_00 = (wostringstream *)std::operator<<(pwVar1,'.');
        pcVar5 = local_1d4 + 1;
      }
      pwVar1 = std::operator<<((wostream *)this_00,pcVar5);
      pwVar1 = std::operator<<(pwVar1,'e');
      pwVar1 = std::operator<<(pwVar1,((int)local_1d8 < 1) * '\x02' + '+');
      iVar3 = local_1d8 - 1;
      iVar4 = -iVar3;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      std::wostream::operator<<((wostream *)pwVar1,iVar4);
      goto LAB_00143311;
    }
    pwVar1 = std::operator<<((wostream *)&woss,"0.");
    local_200[0] = local_1f0;
    std::__cxx11::wstring::_M_construct((ulong)local_200,-local_1d8);
    pwVar1 = std::operator<<(pwVar1,(wstring *)local_200);
    std::operator<<(pwVar1,local_1d4);
  }
  std::__cxx11::wstring::~wstring((wstring *)local_200);
LAB_00143311:
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&woss);
  return __return_storage_ptr__;
}

Assistant:

std::wstring do_format_double(double m, int k) {
    auto [k_, n, s] = do_ecvt(m, k); (void)k_;

    std::wostringstream woss;
    if (k <= n && n <= 21) {
        // 6. If k <= n <= 21, return the string consisting of the k digits of the decimal
        // representation of s (in order, with no leading zeroes), followed by n - k
        // occurences of the character �0�
        woss << s << std::wstring(n-k, '0');
    } else if (0 < n && n <= 21) {
        // 7. If 0 < n <= 21, return the string consisting of the most significant n digits
        // of the decimal representation of s, followed by a decimal point �.�, followed
        // by the remaining k - n digits of the decimal representation of s.
        woss << std::wstring(s, s + n) << '.' << std::wstring(s + n, s + std::strlen(s));
    } else if (-6 < n && n <= 0) {
        // 8. If -6 < n <= 0, return the string consisting of the character �0�, followed
        // by a decimal point �.�, followed by -n occurences of the character �0�, followed
        // by the k digits of the decimal representation of s.
        woss << "0." << std::wstring(-n, '0') << s;
    } else if (k == 1) {
        // 9.  Otherwise, if k = 1, return the string consisting of the single digit of s,
        // followed by lowercase character �e�, followed by a plus sign �+� or minus sign
        // �-� according to whether n - 1 is positive or negative, followed by the decimal
        // representation of the integer abs(n - 1) (with no leading zeros).
        woss << s << 'e' << (n-1>=0?'+':'-') << std::abs(n-1);
    } else {
        // 10. Return the string consisting of the most significant digit of the decimal
        // representation of s, followed by a decimal point �.�, followed by the remaining
        // k - 1 digits of the decimal representation of s , followed by the lowercase character
        // �e�, followed by a plus sign �+� or minus sign �-� according to whether n - 1 is positive
        // or negative, followed by the decimal representation of the integer abs(n - 1)
        // (with no leading zeros)
        woss << s[0] << '.' << s+1 << 'e' << (n-1>=0?'+':'-') << std::abs(n-1);
    }
    return woss.str();
}